

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void slang::ast::VariableSymbol::fromSyntax
               (Compilation *compilation,DataDeclarationSyntax *syntax,Scope *scope,
               bool isCheckerFreeVar,SmallVectorBase<slang::ast::VariableSymbol_*> *results)

{
  Token *this;
  undefined1 *puVar1;
  undefined8 *puVar2;
  pointer pTVar3;
  size_t sVar4;
  char *pcVar5;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar6;
  char cVar7;
  bool bVar8;
  VariableLifetime VVar9;
  DeclaratorSyntax *decl;
  VariableSymbol *this_00;
  undefined7 in_register_00000009;
  ulong uVar10;
  long lVar11;
  SourceRange SVar12;
  optional<slang::ast::VariableLifetime> lifetime;
  Token mod;
  VariableSymbol *variable;
  ulong local_98;
  undefined4 local_8c;
  undefined8 local_88;
  ulong local_80;
  ParentList *local_78;
  Info *pIStack_70;
  ParentList *local_68;
  string_view local_60;
  Info *local_50;
  Compilation *local_48;
  SmallVectorBase<slang::ast::VariableSymbol_*> *local_40;
  SourceLocation local_38;
  
  local_8c = (undefined4)CONCAT71(in_register_00000009,isCheckerFreeVar);
  local_48 = compilation;
  local_40 = results;
  cVar7 = Scope::isProceduralContext(scope);
  local_98._0_5_ = (uint5)(VariableLifetime)local_98;
  pTVar3 = (syntax->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  sVar4 = (syntax->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  uVar10 = 0x100000001;
  local_80 = 0;
  bVar6 = false;
  local_68 = (ParentList *)CONCAT71(local_68._1_7_,cVar7);
  local_88 = 0x100000001;
  for (lVar11 = 0; sVar4 << 4 != lVar11; lVar11 = lVar11 + 0x10) {
    puVar2 = (undefined8 *)((long)&pTVar3->kind + lVar11);
    local_78 = (ParentList *)*puVar2;
    pIStack_70 = (Info *)puVar2[1];
    if ((TokenKind)local_78 == AutomaticKeyword) {
      local_98 = 0x100000000;
      local_80 = 0x100000001;
      if (cVar7 == '\0') {
        SVar12 = parsing::Token::range((Token *)&local_78);
        Scope::addDiag(scope,(DiagCode)0x50006,SVar12);
        local_98 = local_88;
        uVar10 = local_88;
        cVar7 = (char)local_68;
      }
    }
    else if ((TokenKind)local_78 != VarKeyword) {
      if ((TokenKind)local_78 == StaticKeyword) {
        local_80 = 0x101;
        local_98 = uVar10;
      }
      else {
        bVar6 = true;
      }
    }
  }
  if ((local_80 & 1) == 0) {
    VVar9 = getDefaultLifetime(scope);
    local_98 = (ulong)VVar9 | 0x100000000;
  }
  if (scope->thisSym->kind == InstanceBody) {
    pcVar5 = scope->thisSym[2].name._M_str;
    local_88 = CONCAT44(local_88._4_4_,
                        (int)CONCAT71((int7)((ulong)pcVar5 >> 8),*(int *)(pcVar5 + 0x48) == 1));
  }
  else {
    local_88 = (ulong)local_88._4_4_ << 0x20;
  }
  local_78 = &syntax->declarators;
  pIStack_70 = (Info *)0x0;
  local_50 = (Info *)((syntax->declarators).elements._M_extent._M_extent_value + 1 >> 1);
  local_68 = local_78;
  for (; (local_78 != local_68 || (pIStack_70 != local_50));
      pIStack_70 = (Info *)((long)&pIStack_70->rawTextPtr + 1)) {
    decl = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
           iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference
                     ((iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)&local_78);
    this = &decl->name;
    local_60 = parsing::Token::valueText(this);
    local_38 = parsing::Token::location(this);
    this_00 = BumpAllocator::
              emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&>
                        (&local_48->super_BumpAllocator,&local_60,&local_38,
                         (VariableLifetime *)&local_98);
    local_60._M_len = (size_t)this_00;
    (this_00->super_ValueSymbol).declaredType.typeOrLink =
         (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
    puVar1 = &(this_00->super_ValueSymbol).declaredType.field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
    ValueSymbol::setFromDeclarator(&this_00->super_ValueSymbol,decl);
    syntax_00._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes((Symbol *)local_60._M_len,scope,syntax_00);
    SmallVectorBase<slang::ast::VariableSymbol*>::emplace_back<slang::ast::VariableSymbol*const&>
              ((SmallVectorBase<slang::ast::VariableSymbol*> *)local_40,(VariableSymbol **)&local_60
              );
    if (bVar6) {
      *(ushort *)(local_60._M_len + 0x154) = *(ushort *)(local_60._M_len + 0x154) | 1;
    }
    if ((char)local_8c != '\0') {
      *(ushort *)(local_60._M_len + 0x154) = *(ushort *)(local_60._M_len + 0x154) | 0x10;
    }
    if ((char)local_88 != '\0') {
      *(uint *)(local_60._M_len + 0x78) = *(uint *)(local_60._M_len + 0x78) | 0x10000;
    }
    if (((VariableLifetime)local_98 == Static && (local_80 & 1) == 0) &&
       (decl->initializer != (EqualsValueClauseSyntax *)0x0)) {
      bVar8 = Scope::isProceduralContext(scope);
      if (bVar8) {
        SVar12 = parsing::Token::range(this);
        Scope::addDiag(scope,(DiagCode)0xf90006,SVar12);
      }
    }
    if ((bVar6) && (decl->initializer == (EqualsValueClauseSyntax *)0x0 && (char)local_8c == '\0'))
    {
      SVar12 = parsing::Token::range(this);
      Scope::addDiag(scope,(DiagCode)0x1f0006,SVar12);
    }
  }
  return;
}

Assistant:

void VariableSymbol::fromSyntax(Compilation& compilation, const DataDeclarationSyntax& syntax,
                                const Scope& scope, bool isCheckerFreeVar,
                                SmallVectorBase<VariableSymbol*>& results) {
    bool isConst = false;
    bool inProceduralContext = scope.isProceduralContext();
    std::optional<VariableLifetime> lifetime;
    for (Token mod : syntax.modifiers) {
        switch (mod.kind) {
            case TokenKind::VarKeyword:
                break;
            case TokenKind::ConstKeyword:
                isConst = true;
                break;
            case TokenKind::StaticKeyword:
                // Static lifetimes are allowed in all contexts.
                lifetime = VariableLifetime::Static;
                break;
            case TokenKind::AutomaticKeyword:
                // Automatic lifetimes are only allowed in procedural contexts.
                lifetime = VariableLifetime::Automatic;
                if (!inProceduralContext) {
                    scope.addDiag(diag::AutomaticNotAllowed, mod.range());
                    lifetime = VariableLifetime::Static;
                }
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    // If no explicit lifetime is provided, find the default one for this scope.
    bool hasExplicitLifetime = lifetime.has_value();
    if (!hasExplicitLifetime)
        lifetime = getDefaultLifetime(scope);

    const bool isInIface =
        scope.asSymbol().kind == SymbolKind::InstanceBody &&
        scope.asSymbol().as<InstanceBodySymbol>().getDefinition().definitionKind ==
            DefinitionKind::Interface;

    for (auto declarator : syntax.declarators) {
        auto variable = compilation.emplace<VariableSymbol>(declarator->name.valueText(),
                                                            declarator->name.location(), *lifetime);
        variable->setDeclaredType(*syntax.type);
        variable->setFromDeclarator(*declarator);
        variable->setAttributes(scope, syntax.attributes);
        results.push_back(variable);

        if (isConst)
            variable->flags |= VariableFlags::Const;

        if (isCheckerFreeVar)
            variable->flags |= VariableFlags::CheckerFreeVariable;

        if (isInIface)
            variable->getDeclaredType()->addFlags(DeclaredTypeFlags::InterfaceVariable);

        // If this is a static variable in a procedural context and it has an initializer,
        // the spec requires that the static keyword must be explicitly provided.
        if (*lifetime == VariableLifetime::Static && !hasExplicitLifetime &&
            declarator->initializer && scope.isProceduralContext()) {
            scope.addDiag(diag::StaticInitializerMustBeExplicit, declarator->name.range());
        }

        // Constants require an initializer.
        if (isConst && !declarator->initializer && !isCheckerFreeVar)
            scope.addDiag(diag::ConstVarNoInitializer, declarator->name.range());
    }
}